

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getRelativeJacobianSparsityPattern
          (KinDynComputations *this,FrameIndex refFrameIndex,FrameIndex frameIndex,
          MatrixView<double> *outJacobian)

{
  long lVar1;
  double dVar2;
  char cVar3;
  uint uVar4;
  size_t r;
  long lVar5;
  long lVar6;
  long *plVar7;
  long lVar8;
  double dVar9;
  ulong uVar10;
  double dVar11;
  double *pdVar12;
  double dVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  double *pdVar18;
  bool bVar19;
  Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>
  local_228;
  Matrix6x6 *local_1d0 [2];
  Matrix<double,_6,_1,_0,_6,_1> *local_1c0;
  SpatialMotionVector column;
  Matrix<double,_6,_1,_0,_6,_1> local_188;
  Matrix6x6 genericAdjointTransform;
  
  if ((outJacobian->m_rows == 6) &&
     (lVar6 = outJacobian->m_cols, lVar5 = iDynTree::Model::getNrOfDOFs(), lVar6 == lVar5)) {
    cVar3 = iDynTree::Model::isValidFrameIndex((long)&this->pimpl->m_robot_model);
    if (cVar3 == '\0') {
      pcVar15 = "getRelativeJacobian";
      pcVar14 = "Frame index out of bounds";
    }
    else {
      cVar3 = iDynTree::Model::isValidFrameIndex((long)&this->pimpl->m_robot_model);
      if (cVar3 != '\0') {
        bVar19 = outJacobian->m_storageOrder == ColumnMajor;
        genericAdjointTransform.m_data[2] = (double)outJacobian->m_cols;
        genericAdjointTransform.m_data[0] = (double)outJacobian->m_storage;
        genericAdjointTransform.m_data[1] = (double)outJacobian->m_rows;
        dVar2 = 4.94065645841247e-324;
        genericAdjointTransform.m_data[4] = dVar2;
        if (bVar19) {
          genericAdjointTransform.m_data[4] = genericAdjointTransform.m_data[1];
        }
        genericAdjointTransform.m_data[3] = genericAdjointTransform.m_data[2];
        if (bVar19) {
          genericAdjointTransform.m_data[3] = dVar2;
        }
        Eigen::
        DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>_>
        ::setZero((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
                   *)&genericAdjointTransform);
        lVar6 = iDynTree::Model::getFrameLink((long)&this->pimpl->m_robot_model);
        iDynTree::Model::getFrameLink((long)&this->pimpl->m_robot_model);
        lVar5 = iDynTree::LinkTraversalsCache::getTraversalWithLinkAsBase
                          ((Model *)&this->pimpl->m_traversalCache,(long)&this->pimpl->m_robot_model
                          );
        MatrixFixSize<6U,_6U>::zero((MatrixFixSize<6U,_6U> *)&genericAdjointTransform);
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_0>
        .m_rows.m_value = 3;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_0>
        ._16_8_ = 3;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_cols.m_value = 0;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .m_xpr.m_stride.m_outer.m_value = 0;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .m_xpr.m_stride.m_inner.m_value = 6;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_0>
        .m_data = (PointerType)&genericAdjointTransform;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_data = (PointerType)&genericAdjointTransform;
        Eigen::
        DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>
        ::setOnes((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                   *)&local_228);
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_0>
        .m_data = genericAdjointTransform.m_data + 3;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_0>
        .m_rows.m_value = 3;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_0>
        ._16_8_ = 3;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_cols.m_value = 0;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .m_xpr.m_stride.m_outer.m_value = 3;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .m_xpr.m_stride.m_inner.m_value = 6;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_data = (PointerType)&genericAdjointTransform;
        Eigen::
        DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>
        ::setOnes((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                   *)&local_228);
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_0>
        .m_data = genericAdjointTransform.m_data + 0x15;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_0>
        .m_rows.m_value = 3;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_0>
        ._16_8_ = 3;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_cols.m_value = 3;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .m_xpr.m_stride.m_outer.m_value = 3;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .m_xpr.m_stride.m_inner.m_value = 6;
        local_228.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_data = (PointerType)&genericAdjointTransform;
        Eigen::
        DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>
        ::setOnes((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                   *)&local_228);
        while( true ) {
          lVar17 = lVar6;
          iDynTree::Traversal::getBaseLink();
          lVar6 = iDynTree::Link::getIndex();
          if (lVar17 == lVar6) break;
          iDynTree::Traversal::getParentLinkFromLinkIndex(lVar5);
          lVar6 = iDynTree::Link::getIndex();
          plVar7 = (long *)iDynTree::Traversal::getParentJointFromLinkIndex(lVar5);
          lVar8 = (**(code **)(*plVar7 + 0xc0))(plVar7);
          for (uVar16 = 0; uVar4 = (**(code **)(*plVar7 + 0x20))(plVar7), uVar16 < uVar4;
              uVar16 = uVar16 + 1) {
            pdVar18 = (double *)&column;
            (**(code **)(*plVar7 + 0x60))(pdVar18,plVar7,uVar16 & 0xffffffff,lVar17,lVar6);
            for (uVar10 = 0; uVar10 != 6; uVar10 = uVar10 + 1) {
              pdVar12 = column.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.
                        super_Vector3.m_data + ((int)uVar10 - 3);
              if (uVar10 < 3) {
                pdVar12 = pdVar18;
              }
              *pdVar12 = (double)(~-(ulong)(ABS(*pdVar12) < DEFAULT_TOL) & 0x3ff0000000000000);
              pdVar18 = pdVar18 + 1;
            }
            toEigen(&local_188,&column);
            local_1d0[0] = &genericAdjointTransform;
            local_228.
            super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
            .m_xpr.
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
            .m_cols.m_value = outJacobian->m_cols;
            local_228.
            super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
            .m_xpr.
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
            .m_data = outJacobian->m_storage;
            local_228.
            super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_0>
            .m_rows.m_value = outJacobian->m_rows;
            local_228.
            super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
            .m_xpr.m_stride.m_outer.m_value =
                 local_228.
                 super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
                 .m_xpr.
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
                 .m_cols.m_value;
            local_228.
            super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
            .m_xpr.m_stride.m_inner.m_value = (long)dVar2;
            if (outJacobian->m_storageOrder == ColumnMajor) {
              local_228.
              super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
              .m_xpr.m_stride.m_outer.m_value = (long)dVar2;
              local_228.
              super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
              .m_xpr.m_stride.m_inner.m_value =
                   local_228.
                   super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_0>
                   .m_rows.m_value;
            }
            lVar1 = lVar8 + uVar16;
            local_228.
            super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_0>
            .m_data = (PointerType)
                      ((long)local_228.
                             super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
                             .
                             super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
                             .m_xpr.
                             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
                             .
                             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
                             .m_data +
                      local_228.
                      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
                      .m_xpr.m_stride.m_inner.m_value * lVar1 * 8);
            local_228.
            super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
            .m_startRow.m_value = 0;
            local_228.
            super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
            .m_xpr.
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
            .m_rows.m_value =
                 local_228.
                 super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_0>
                 .m_rows.m_value;
            local_228.
            super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
            .m_startCol.m_value = lVar1;
            local_228.
            super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
            .m_outerStride =
                 local_228.
                 super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false,_true>
                 .m_xpr.m_stride.m_inner.m_value;
            local_1c0 = &local_188;
            Eigen::internal::
            call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,_1,1,false>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,6,1,0,6,1>,0>>
                      (&local_228,
                       (Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                        *)local_1d0);
            for (dVar9 = 0.0; (ulong)dVar9 < (ulong)outJacobian->m_rows;
                dVar9 = (double)((long)dVar9 + 1)) {
              dVar11 = (double)outJacobian->m_rows;
              dVar13 = dVar2;
              if (outJacobian->m_storageOrder != ColumnMajor) {
                dVar13 = (double)outJacobian->m_cols;
                dVar11 = dVar2;
              }
              outJacobian->m_storage[(long)dVar11 * lVar1 + (long)dVar13 * (long)dVar9] =
                   (element_type)
                   (~-(ulong)(ABS(outJacobian->m_storage
                                  [(long)dVar11 * lVar1 + (long)dVar13 * (long)dVar9]) < DEFAULT_TOL
                             ) & 0x3ff0000000000000);
            }
          }
        }
        return true;
      }
      pcVar15 = "getRelativeJacobian";
      pcVar14 = "Reference frame index out of bounds";
    }
  }
  else {
    pcVar15 = "getRelativeJacobianSparsityPattern";
    pcVar14 = "Wrong size in input outJacobian";
  }
  iDynTree::reportError("KinDynComputations",pcVar15,pcVar14);
  return false;
}

Assistant:

bool KinDynComputations::getRelativeJacobianSparsityPattern(const iDynTree::FrameIndex refFrameIndex,
                                                            const iDynTree::FrameIndex frameIndex,
                                                            MatrixView<double> outJacobian) const
    {
        bool ok = (outJacobian.rows() == 6)
            && (outJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs());

        if( !ok )
        {
            reportError("KinDynComputations","getRelativeJacobianSparsityPattern","Wrong size in input outJacobian");
            return false;
        }

        if (!pimpl->m_robot_model.isValidFrameIndex(frameIndex))
        {
            reportError("KinDynComputations","getRelativeJacobian","Frame index out of bounds");
            return false;
        }
        if (!pimpl->m_robot_model.isValidFrameIndex(refFrameIndex))
        {
            reportError("KinDynComputations","getRelativeJacobian","Reference frame index out of bounds");
            return false;
        }

        // clear the matrix
        toEigen(outJacobian).setZero();

        // This method computes the sparsity pattern of the relative Jacobian.
        // For details on how to compute the relative Jacobian, see Traversaro's PhD thesis, 3.37
        // or getRelativeJacobianExplicit method.
        // Here we simply implement the same code, but trying to obtain only 1 and zeros.

        // Get the links to which the frames are attached
        LinkIndex jacobianLinkIndex = pimpl->m_robot_model.getFrameLink(frameIndex);
        LinkIndex refJacobianLink = pimpl->m_robot_model.getFrameLink(refFrameIndex);

        iDynTree::Traversal& relativeTraversal = pimpl->m_traversalCache.getTraversalWithLinkAsBase(pimpl->m_robot_model, refJacobianLink);

        // Compute joint part
        // We iterate from the link up in the traveral until we reach the base
        LinkIndex visitedLinkIdx = jacobianLinkIndex;

        // Generic adjoint transform matrix (6x6).
        // Rotations are filled with 1.
        Matrix6x6 genericAdjointTransform;
        genericAdjointTransform.zero();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).topLeftCorner(3, 3).setOnes();
        // Set 1 to p \times R (top right)
        iDynTree::toEigen(genericAdjointTransform).topRightCorner(3, 3).setOnes();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).bottomRightCorner(3, 3).setOnes();


        while (visitedLinkIdx != relativeTraversal.getBaseLink()->getIndex())
        {
            //get the pair of links in the traversal
            LinkIndex parentLinkIdx = relativeTraversal.getParentLinkFromLinkIndex(visitedLinkIdx)->getIndex();
            IJointConstPtr joint = relativeTraversal.getParentJointFromLinkIndex(visitedLinkIdx);

            //Now for each Dof get the motion subspace
            //{}^F s_{E,F}, i.e. the velocity of F wrt E written in F.
            size_t dofOffset = joint->getDOFsOffset();
            for (int i = 0; i < joint->getNrOfDOFs(); ++i)
            {
                // This is actually where we specify the pattern
                SpatialMotionVector column = joint->getMotionSubspaceVector(i, visitedLinkIdx, parentLinkIdx);
                for (size_t c = 0; c < column.size(); ++c) {
                    column(c) = std::abs(column(c)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }
                toEigen(outJacobian).col(dofOffset + i) = toEigen(genericAdjointTransform) * toEigen(column);
                //have only 0 and 1 => divide component wise the column by itself
                for (size_t r = 0; r < toEigen(outJacobian).col(dofOffset + i).size(); ++r) {
                    toEigen(outJacobian).col(dofOffset + i).coeffRef(r) = std::abs(toEigen(outJacobian).col(dofOffset + i).coeffRef(r)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }

            }

            visitedLinkIdx = parentLinkIdx;
        }
        return true;
    }